

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

void rename_var(VarId *id,BasicBlock *b,
               map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               *nodes,map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *dom_tree)

{
  bool bVar1;
  __optional_eq_t<mir::inst::VarId,_mir::inst::VarId> _Var2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  reference pvVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  element_type *peVar18;
  element_type *peVar19;
  pointer ppVar20;
  pointer ppVar21;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int __c_09;
  BasicBlock *in_RDX;
  VarId *in_RSI;
  char *pcVar22;
  VarId *pVVar23;
  VarId *in_RDI;
  iterator it;
  int i_2;
  iterator dtr;
  shared_ptr<mir::inst::PhiInst> in_8;
  shared_ptr<mir::inst::Inst> ins_2;
  int i_1;
  BasicBlock *bb;
  iterator iter;
  int j;
  shared_ptr<mir::inst::JumpInstruction> ins_1;
  VarId xv_6;
  shared_ptr<mir::inst::PhiInst> in_7;
  VarId xv_5;
  VarId x_7;
  shared_ptr<mir::inst::RefInst> in_6;
  VarId xv_4;
  VarId x_6;
  shared_ptr<mir::inst::PtrOffsetInst> in_5;
  VarId x_5;
  shared_ptr<mir::inst::StoreInst> in_4;
  VarId xv_3;
  VarId x_4;
  shared_ptr<mir::inst::LoadInst> in_3;
  VarId xv_2;
  VarId x_3;
  VarId x_2;
  shared_ptr<mir::inst::OpInst> in_2;
  VarId xv_1;
  VarId x_1;
  int k;
  shared_ptr<mir::inst::CallInst> in_1;
  VarId xv;
  VarId x;
  shared_ptr<mir::inst::AssignInst> in;
  shared_ptr<mir::inst::Inst> ins;
  int i;
  VarId ve;
  VarId *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  VarId *in_stack_fffffffffffff8a8;
  optional<mir::inst::VarId> *in_stack_fffffffffffff8b0;
  VarId local_460 [8];
  _Base_ptr local_3e0;
  int local_3d4;
  _Self local_3d0;
  _Self local_3c8 [7];
  int local_38c;
  BasicBlock *local_388;
  _Base_ptr local_380;
  int local_374;
  char local_340 [16];
  char local_330 [48];
  char local_300 [16];
  char local_2f0 [32];
  VarId local_2d0 [3];
  char local_2a0 [16];
  char local_290 [48];
  VarId local_260 [4];
  VarId local_220 [3];
  char local_1f0 [16];
  char local_1e0 [32];
  VarId local_1c0 [3];
  char local_190 [16];
  char local_180 [32];
  VarId local_160;
  VarId local_150;
  VarId local_140 [3];
  char local_110 [16];
  char local_100 [32];
  VarId local_e0;
  int local_cc;
  char local_a8 [16];
  char local_98 [32];
  VarId local_78 [3];
  VarId local_48;
  int local_34;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  top();
  for (local_34 = 0; uVar6 = (ulong)local_34,
      sVar7 = std::
              vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
              ::size((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                      *)&in_RSI->id), uVar6 < sVar7; local_34 = local_34 + 1) {
    pcVar22 = (char *)(long)local_34;
    pvVar8 = std::
             vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
             ::operator[]((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                           *)&in_RSI->id,(size_type)pcVar22);
    pcVar22 = std::
              variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ::index(pvVar8,pcVar22,__c);
    if (pcVar22 == (char *)0x0) {
      std::
      vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      ::operator[]((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                    *)&in_RSI->id,(long)local_34);
      std::
      get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                  *)0x2805c8);
      std::shared_ptr<mir::inst::Inst>::shared_ptr
                ((shared_ptr<mir::inst::Inst> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff898);
      peVar9 = std::__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2805ed);
      iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
      if (iVar3 == 0) {
        pVVar23 = &local_48;
        std::static_pointer_cast<mir::inst::AssignInst,mir::inst::Inst>
                  ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
        peVar10 = std::
                  __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x280634);
        pcVar22 = std::variant<int,_mir::inst::VarId>::index
                            ((variant<int,_mir::inst::VarId> *)&(peVar10->src).field_0x8,
                             (char *)pVVar23,__c_00);
        if (pcVar22 == (char *)0x1) {
          std::__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x28065b);
          std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x280667);
          mir::inst::VarId::VarId
                    ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     in_stack_fffffffffffff898);
          bVar1 = mir::inst::VarId::operator==(local_78,in_RDI);
          if (bVar1) {
            std::
            __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2806c9);
            top();
            std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                      ((variant<int,_mir::inst::VarId> *)
                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898);
          }
        }
        peVar10 = std::
                  __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x280751);
        bVar1 = mir::inst::VarId::operator==(&(peVar10->super_Inst).dest,in_RDI);
        if (bVar1) {
          mir::inst::VarId::VarId
                    ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     in_stack_fffffffffffff898);
          rename(local_98,local_a8);
          std::__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2807bf);
          mir::inst::VarId::operator=
                    ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     in_stack_fffffffffffff898);
          mir::inst::VarId::VarId
                    ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     in_stack_fffffffffffff898);
          push((VarId *)0x280805);
        }
        std::shared_ptr<mir::inst::AssignInst>::~shared_ptr
                  ((shared_ptr<mir::inst::AssignInst> *)0x280816);
      }
      else {
        peVar9 = std::__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x280828);
        iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
        if (iVar3 == 6) {
          std::static_pointer_cast<mir::inst::CallInst,mir::inst::Inst>
                    ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
          local_cc = 0;
          while( true ) {
            uVar6 = (ulong)local_cc;
            peVar11 = std::
                      __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x28088a);
            sVar7 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                              (&peVar11->params);
            if (sVar7 <= uVar6) break;
            peVar11 = std::
                      __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2808b7);
            pcVar22 = (char *)(long)local_cc;
            pvVar12 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                (&peVar11->params,(size_type)pcVar22);
            pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                ((variant<int,_mir::inst::VarId> *)&pvVar12->field_0x8,pcVar22,
                                 __c_01);
            if (pcVar22 == (char *)0x1) {
              peVar11 = std::
                        __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x2808ee);
              std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                        (&peVar11->params,(long)local_cc);
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x28090e);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              bVar1 = mir::inst::VarId::operator==(&local_e0,in_RDI);
              if (bVar1) {
                peVar11 = std::
                          __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x280970);
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                          (&peVar11->params,(long)local_cc);
                top();
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
              }
            }
            local_cc = local_cc + 1;
          }
          peVar11 = std::
                    __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x280a0b);
          bVar1 = mir::inst::VarId::operator==(&(peVar11->super_Inst).dest,in_RDI);
          if (bVar1) {
            mir::inst::VarId::VarId
                      ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898);
            rename(local_100,local_110);
            std::__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x280a79);
            mir::inst::VarId::operator=
                      ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898);
            mir::inst::VarId::VarId
                      ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898);
            push((VarId *)0x280abf);
          }
          std::shared_ptr<mir::inst::CallInst>::~shared_ptr
                    ((shared_ptr<mir::inst::CallInst> *)0x280ad0);
        }
        else {
          peVar9 = std::
                   __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x280ae2);
          iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
          if (iVar3 == 1) {
            pVVar23 = &local_48;
            std::static_pointer_cast<mir::inst::OpInst,mir::inst::Inst>
                      ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
            peVar13 = std::
                      __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x280b29);
            pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                ((variant<int,_mir::inst::VarId> *)&(peVar13->lhs).field_0x8,
                                 (char *)pVVar23,__c_02);
            if (pcVar22 == (char *)0x1) {
              std::__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280b50);
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x280b5c);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              pVVar23 = in_RDI;
              bVar1 = mir::inst::VarId::operator==(local_140,in_RDI);
              if (bVar1) {
                std::
                __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280bbb);
                pVVar23 = &local_150;
                top();
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
              }
            }
            peVar13 = std::
                      __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x280c2a);
            pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                ((variant<int,_mir::inst::VarId> *)&(peVar13->rhs).field_0x8,
                                 (char *)pVVar23,__c_03);
            if (pcVar22 == (char *)0x1) {
              std::__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280c51);
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x280c5d);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              bVar1 = mir::inst::VarId::operator==(&local_160,in_RDI);
              if (bVar1) {
                std::
                __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280cbc);
                top();
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
              }
            }
            peVar13 = std::
                      __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x280d05);
            bVar1 = mir::inst::VarId::operator==(&(peVar13->super_Inst).dest,in_RDI);
            if (bVar1) {
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              rename(local_180,local_190);
              std::__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280d73);
              mir::inst::VarId::operator=
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              mir::inst::VarId::VarId
                        ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         in_stack_fffffffffffff898);
              push((VarId *)0x280db9);
            }
            std::shared_ptr<mir::inst::OpInst>::~shared_ptr
                      ((shared_ptr<mir::inst::OpInst> *)0x280dca);
          }
          else {
            peVar9 = std::
                     __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x280ddc);
            iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
            if (iVar3 == 3) {
              pVVar23 = &local_48;
              std::static_pointer_cast<mir::inst::LoadInst,mir::inst::Inst>
                        ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
              peVar14 = std::
                        __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x280e23);
              pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                  ((variant<int,_mir::inst::VarId> *)&(peVar14->src).field_0x8,
                                   (char *)pVVar23,__c_04);
              if (pcVar22 == (char *)0x1) {
                std::
                __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280e4a);
                std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x280e56);
                mir::inst::VarId::VarId
                          ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
                bVar1 = mir::inst::VarId::operator==(local_1c0,in_RDI);
                if (bVar1) {
                  std::
                  __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x280eb5);
                  top();
                  std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)
                             CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             in_stack_fffffffffffff898);
                }
              }
              peVar14 = std::
                        __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x280f24);
              bVar1 = mir::inst::VarId::operator==(&(peVar14->super_Inst).dest,in_RDI);
              if (bVar1) {
                mir::inst::VarId::VarId
                          ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
                rename(local_1e0,local_1f0);
                std::
                __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x280f92);
                mir::inst::VarId::operator=
                          ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
                mir::inst::VarId::VarId
                          ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           in_stack_fffffffffffff898);
                push((VarId *)0x280fd8);
              }
              std::shared_ptr<mir::inst::LoadInst>::~shared_ptr
                        ((shared_ptr<mir::inst::LoadInst> *)0x280fe9);
            }
            else {
              peVar9 = std::
                       __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x280ffb);
              iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
              if (iVar3 == 4) {
                pVVar23 = &local_48;
                std::static_pointer_cast<mir::inst::StoreInst,mir::inst::Inst>
                          ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
                peVar15 = std::
                          __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x281042);
                pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                    ((variant<int,_mir::inst::VarId> *)&(peVar15->val).field_0x8,
                                     (char *)pVVar23,__c_05);
                if (pcVar22 == (char *)0x1) {
                  std::
                  __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x281069);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x281075);
                  mir::inst::VarId::VarId
                            ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             in_stack_fffffffffffff898);
                  bVar1 = mir::inst::VarId::operator==(local_220,in_RDI);
                  if (bVar1) {
                    std::
                    __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2810d4);
                    top();
                    std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                               in_stack_fffffffffffff898);
                  }
                }
                peVar15 = std::
                          __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x281143);
                bVar1 = mir::inst::VarId::operator==(&(peVar15->super_Inst).dest,in_RDI);
                if (bVar1) {
                  top();
                  std::
                  __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x281187);
                  mir::inst::VarId::operator=
                            ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                             in_stack_fffffffffffff898);
                }
                std::shared_ptr<mir::inst::StoreInst>::~shared_ptr
                          ((shared_ptr<mir::inst::StoreInst> *)0x2811a8);
              }
              else {
                peVar9 = std::
                         __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2811ba);
                iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
                if (iVar3 == 5) {
                  pVVar23 = &local_48;
                  std::static_pointer_cast<mir::inst::PtrOffsetInst,mir::inst::Inst>
                            ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
                  peVar16 = std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x281201);
                  pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                      ((variant<int,_mir::inst::VarId> *)
                                       &(peVar16->offset).field_0x8,(char *)pVVar23,__c_06);
                  if (pcVar22 == (char *)0x1) {
                    std::
                    __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x281228);
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x281234);
                    mir::inst::VarId::VarId
                              ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0
                                                ),in_stack_fffffffffffff898);
                    bVar1 = mir::inst::VarId::operator==(local_260,in_RDI);
                    if (bVar1) {
                      std::
                      __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x281293);
                      top();
                      std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                 in_stack_fffffffffffff898);
                    }
                  }
                  peVar16 = std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x281302);
                  bVar1 = mir::inst::VarId::operator==(&peVar16->ptr,in_RDI);
                  if (bVar1) {
                    top();
                    std::
                    __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x281346);
                    mir::inst::VarId::operator=
                              ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0
                                                ),in_stack_fffffffffffff898);
                  }
                  peVar16 = std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x281367);
                  bVar1 = mir::inst::VarId::operator==(&(peVar16->super_Inst).dest,in_RDI);
                  if (bVar1) {
                    mir::inst::VarId::VarId
                              ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0
                                                ),in_stack_fffffffffffff898);
                    rename(local_290,local_2a0);
                    std::
                    __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2813d5);
                    mir::inst::VarId::operator=
                              ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0
                                                ),in_stack_fffffffffffff898);
                    mir::inst::VarId::VarId
                              ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0
                                                ),in_stack_fffffffffffff898);
                    push((VarId *)0x28141b);
                  }
                  std::shared_ptr<mir::inst::PtrOffsetInst>::~shared_ptr
                            ((shared_ptr<mir::inst::PtrOffsetInst> *)0x28142c);
                }
                else {
                  peVar9 = std::
                           __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x28143e);
                  iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
                  if (iVar3 == 2) {
                    pVVar23 = &local_48;
                    std::static_pointer_cast<mir::inst::RefInst,mir::inst::Inst>
                              ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
                    peVar17 = std::
                              __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x281485);
                    pcVar22 = std::
                              variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::index(&peVar17->val,(char *)pVVar23,__c_07);
                    if (pcVar22 == (char *)0x0) {
                      std::
                      __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2814a8);
                      std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x2814b4);
                      mir::inst::VarId::VarId
                                ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                   in_stack_fffffffffffff8a0),
                                 in_stack_fffffffffffff898);
                      bVar1 = mir::inst::VarId::operator==(local_2d0,in_RDI);
                      if (bVar1) {
                        std::
                        __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x281513);
                        top();
                        std::variant<mir::inst::VarId,std::__cxx11::string>::
                        emplace<0ul,mir::inst::VarId>
                                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   in_stack_fffffffffffff898);
                      }
                    }
                    peVar17 = std::
                              __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x281582);
                    bVar1 = mir::inst::VarId::operator==(&(peVar17->super_Inst).dest,in_RDI);
                    if (bVar1) {
                      mir::inst::VarId::VarId
                                ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                   in_stack_fffffffffffff8a0),
                                 in_stack_fffffffffffff898);
                      rename(local_2f0,local_300);
                      std::
                      __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2815f0);
                      mir::inst::VarId::operator=
                                ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                   in_stack_fffffffffffff8a0),
                                 in_stack_fffffffffffff898);
                      mir::inst::VarId::VarId
                                ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                   in_stack_fffffffffffff8a0),
                                 in_stack_fffffffffffff898);
                      push((VarId *)0x281636);
                    }
                    std::shared_ptr<mir::inst::RefInst>::~shared_ptr
                              ((shared_ptr<mir::inst::RefInst> *)0x281647);
                  }
                  else {
                    peVar9 = std::
                             __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x281659);
                    iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
                    if (iVar3 == 7) {
                      std::static_pointer_cast<mir::inst::PhiInst,mir::inst::Inst>
                                ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
                      peVar18 = std::
                                __shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x2816a8);
                      bVar1 = mir::inst::VarId::operator==(&(peVar18->super_Inst).dest,in_RDI);
                      if (bVar1) {
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                     in_stack_fffffffffffff8a0),
                                   in_stack_fffffffffffff898);
                        rename(local_330,local_340);
                        std::
                        __shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x281710);
                        mir::inst::VarId::operator=
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                     in_stack_fffffffffffff8a0),
                                   in_stack_fffffffffffff898);
                        mir::inst::VarId::VarId
                                  ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,
                                                     in_stack_fffffffffffff8a0),
                                   in_stack_fffffffffffff898);
                        push((VarId *)0x28174a);
                      }
                      std::shared_ptr<mir::inst::PhiInst>::~shared_ptr
                                ((shared_ptr<mir::inst::PhiInst> *)0x28177e);
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x28179d);
    }
    else {
      pcVar22 = (char *)(long)local_34;
      pvVar8 = std::
               vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               ::operator[]((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                             *)&in_RSI->id,(size_type)pcVar22);
      pcVar22 = std::
                variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                ::index(pvVar8,pcVar22,__c_08);
      if (pcVar22 == (char *)0x1) {
        std::
        vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
        ::operator[]((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                      *)&in_RSI->id,(long)local_34);
        std::
        get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                  ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                    *)0x281800);
        std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr
                  ((shared_ptr<mir::inst::JumpInstruction> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (shared_ptr<mir::inst::JumpInstruction> *)in_stack_fffffffffffff898);
        peVar19 = std::
                  __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x28181d);
        if ((peVar19->kind == BrCond) ||
           (peVar19 = std::
                      __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x281830), peVar19->kind == Return)) {
          std::
          __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x281847);
          bVar1 = std::optional::operator_cast_to_bool((optional<mir::inst::VarId> *)0x281853);
          if (bVar1) {
            std::
            __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x281869);
            _Var2 = std::operator==((optional<mir::inst::VarId> *)
                                    CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                    in_stack_fffffffffffff898);
            if (_Var2) {
              top();
              std::
              __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2818a7);
              std::optional<mir::inst::VarId>::operator=
                        (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
            }
          }
        }
        std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
                  ((shared_ptr<mir::inst::JumpInstruction> *)0x2818f2);
      }
    }
  }
  for (local_374 = 0; uVar6 = (ulong)local_374,
      sVar7 = std::
              vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
              ::size((vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                      *)(in_RSI + 2)), uVar6 < sVar7; local_374 = local_374 + 1) {
    std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>::
    operator[]((vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                *)(in_RSI + 2),(long)local_374);
    local_380 = (_Base_ptr)
                std::
                map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                        *)in_stack_fffffffffffff898,(key_type *)0x28196f);
    ppVar20 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
              operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *
                         )0x281984);
    local_388 = ppVar20->second;
    for (local_38c = 0; uVar6 = (ulong)local_38c,
        sVar7 = std::
                vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                ::size(&local_388->inst), uVar6 < sVar7; local_38c = local_38c + 1) {
      pcVar22 = (char *)(long)local_38c;
      pvVar8 = std::
               vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               ::operator[](&local_388->inst,(size_type)pcVar22);
      pcVar22 = std::
                variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                ::index(pvVar8,pcVar22,__c_09);
      if (pcVar22 == (char *)0x0) {
        std::
        vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
        ::operator[](&local_388->inst,(long)local_38c);
        std::
        get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                  ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                    *)0x281a16);
        std::shared_ptr<mir::inst::Inst>::shared_ptr
                  ((shared_ptr<mir::inst::Inst> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff898);
        peVar9 = std::__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x281a35);
        iVar3 = (*(peVar9->super_Displayable)._vptr_Displayable[1])();
        if (iVar3 == 7) {
          std::static_pointer_cast<mir::inst::PhiInst,mir::inst::Inst>
                    ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffff8a8);
          peVar18 = std::
                    __shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x281a78);
          bVar1 = mir::inst::VarId::operator==(&peVar18->ori_var,in_RDI);
          if (bVar1) {
            std::__shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mir::inst::PhiInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x281aa9);
            top();
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898);
          }
          std::shared_ptr<mir::inst::PhiInst>::~shared_ptr
                    ((shared_ptr<mir::inst::PhiInst> *)0x281b1d);
        }
        std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x281b2a);
      }
    }
  }
  local_3c8[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)in_stack_fffffffffffff898,(key_type *)0x281b83);
  local_3d0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)in_stack_fffffffffffff898);
  bVar1 = std::operator!=(local_3c8,&local_3d0);
  if (bVar1) {
    local_3d4 = 0;
    while( true ) {
      uVar6 = (ulong)local_3d4;
      ppVar21 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                            *)0x281be3);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&ppVar21->second);
      if (sVar7 <= uVar6) break;
      ppVar21 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                            *)0x281c0d);
      std::vector<int,_std::allocator<int>_>::operator[](&ppVar21->second,(long)local_3d4);
      local_3e0 = (_Base_ptr)
                  std::
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                          *)in_stack_fffffffffffff898,(key_type *)0x281c31);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x281c5b);
      std::
      map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
             *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
            (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
             *)in_stack_fffffffffffff898);
      std::
      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
            (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)in_stack_fffffffffffff898);
      rename_var(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::
      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)0x281cc1);
      std::
      map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
              *)0x281cce);
      local_3d4 = local_3d4 + 1;
    }
  }
  while( true ) {
    top();
    uVar4 = mir::inst::VarId::operator_cast_to_unsigned_int(local_460);
    uVar5 = mir::inst::VarId::operator_cast_to_unsigned_int((VarId *)&stack0xffffffffffffffd0);
    if (uVar4 == uVar5) break;
    pop();
  }
  return;
}

Assistant:

void rename_var(mir::inst::VarId id, BasicBlock* b, map<int, BasicBlock*> nodes,
                map<int, vector<int>> dom_tree) {
  mir::inst::VarId ve = top();
  for (int i = 0; i < b->inst.size(); i++) {
    if (b->inst[i].index() == 0) {
      shared_ptr<mir::inst::Inst> ins = get<0>(b->inst[i]);
      if (ins->inst_kind() == mir::inst::InstKind::Assign) {
        shared_ptr<mir::inst::AssignInst> in =
            static_pointer_cast<mir::inst::AssignInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
        shared_ptr<mir::inst::CallInst> in =
            static_pointer_cast<mir::inst::CallInst>(ins);
        for (int k = 0; k < in->params.size(); k++) {
          if (in->params[k].index() == 1) {
            mir::inst::VarId x = get<1>(in->params[k]);
            if (x == id) {
              in->params[k].emplace<1>(top());
            }
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
        shared_ptr<mir::inst::OpInst> in =
            static_pointer_cast<mir::inst::OpInst>(ins);
        if (in->lhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->lhs);
          if (x == id) {
            in->lhs.emplace<1>(top());
          }
        }
        if (in->rhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->rhs);
          if (x == id) {
            in->rhs.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
        shared_ptr<mir::inst::LoadInst> in =
            static_pointer_cast<mir::inst::LoadInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
        shared_ptr<mir::inst::StoreInst> in =
            static_pointer_cast<mir::inst::StoreInst>(ins);
        if (in->val.index() == 1) {
          mir::inst::VarId x = get<1>(in->val);
          if (x == id) {
            in->val.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          in->dest = top();
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
        shared_ptr<mir::inst::PtrOffsetInst> in =
            static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
        if (in->offset.index() == 1) {
          mir::inst::VarId x = get<1>(in->offset);
          if (x == id) {
            in->offset.emplace<1>(top());
          }
        }
        if (in->ptr == id) {
          in->ptr = top();
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
        shared_ptr<mir::inst::RefInst> in =
            static_pointer_cast<mir::inst::RefInst>(ins);
        if (in->val.index() == 0) {
          mir::inst::VarId x = get<0>(in->val);
          if (x == id) {
            in->val.emplace<0>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Phi) {
        shared_ptr<mir::inst::PhiInst> in =
            static_pointer_cast<mir::inst::PhiInst>(ins);
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else {
        // nothing
      }
    } else if (b->inst[i].index() == 1) {
      shared_ptr<mir::inst::JumpInstruction> ins = get<1>(b->inst[i]);
      if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
          ins->kind == mir::inst::JumpInstructionKind::Return) {
        if (ins->cond_or_ret && ins->cond_or_ret == id) {
          ins->cond_or_ret = top();
        }
      }
    }
  }
  for (int j = 0; j < b->nextBlock.size(); j++) {
    map<int, BasicBlock*>::iterator iter = nodes.find(b->nextBlock[j]->id);
    BasicBlock* bb = iter->second;
    for (int i = 0; i < bb->inst.size(); i++) {
      if (bb->inst[i].index() == 0) {
        shared_ptr<mir::inst::Inst> ins = get<0>(bb->inst[i]);
        if (ins->inst_kind() == mir::inst::InstKind::Phi) {
          shared_ptr<mir::inst::PhiInst> in =
              static_pointer_cast<mir::inst::PhiInst>(ins);
          if (in->ori_var == id) {
            in->vars.push_back(top());
          }
        }
      }
    }
  }
  map<int, vector<int>>::iterator dtr = dom_tree.find(b->id);
  if (dtr != dom_tree.end()) {
    for (int i = 0; i < dtr->second.size(); i++) {
      map<int, BasicBlock*>::iterator it = nodes.find(dtr->second[i]);
      rename_var(id, it->second, nodes, dom_tree);
    }
  }
  while (top() != ve) {
    pop();
  }
}